

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::operator==
          (Minefield_Response_NACK_PDU *this,Minefield_Response_NACK_PDU *Value)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  KBOOL KVar2;
  int iVar3;
  size_t __n;
  
  KVar2 = Minefield_Header::operator!=(&this->super_Minefield_Header,&Value->super_Minefield_Header)
  ;
  if ((((!KVar2) &&
       (KVar2 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_ReqID,&Value->m_ReqID), !KVar2)) &&
      (this->m_ui8ReqID == Value->m_ui8ReqID)) && (this->m_ui8NumMisPdus == Value->m_ui8NumMisPdus))
  {
    __s1 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (Value->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if (__n == (long)(Value->m_vSeqNums).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 != __s1) {
        iVar3 = bcmp(__s1,__s2,__n);
        return iVar3 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

KBOOL Minefield_Response_NACK_PDU::operator == ( const Minefield_Response_NACK_PDU & Value ) const
{
    if( Minefield_Header::operator != ( Value ) )             return false;
    if( m_ReqID                    != Value.m_ReqID )         return false;
    if( m_ui8ReqID                 != Value.m_ui8ReqID )      return false;
    if( m_ui8NumMisPdus            != Value.m_ui8NumMisPdus ) return false;
    if( m_vSeqNums                 != Value.m_vSeqNums )      return false;
    return true;
}